

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  int64 iVar6;
  undefined4 extraout_var_00;
  MessageLite *pMVar7;
  Extension *extension;
  Extension *local_20;
  undefined4 extraout_var_01;
  
  bVar2 = MaybeNewExtension(this,*(int *)(descriptor + 0x44),descriptor,&local_20);
  if (bVar2) {
    TVar3 = FieldDescriptor::type(descriptor);
    local_20->type = (FieldType)TVar3;
    local_20->is_repeated = false;
    local_20->is_packed = false;
    pDVar5 = FieldDescriptor::message_type(descriptor);
    iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
    local_20->field_0xa = local_20->field_0xa & 0xf;
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar4),this->arena_);
    (local_20->field_0).int64_value = iVar6;
    local_20->field_0xa = local_20->field_0xa & 0xf0;
    pMVar7 = (MessageLite *)(local_20->field_0).int64_value;
  }
  else {
    bVar1 = local_20->field_0xa;
    local_20->field_0xa = bVar1 & 0xf0;
    pMVar7 = (local_20->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
      iVar4 = (*pMVar7->_vptr_MessageLite[4])(pMVar7,CONCAT44(extraout_var_00,iVar4));
      pMVar7 = (MessageLite *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return pMVar7;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}